

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_file.cpp
# Opt level: O2

void __thiscall
ManifestFile::GetInstanceExtensionProperties
          (ManifestFile *this,
          vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_> *props)

{
  pointer pEVar1;
  pointer pXVar2;
  pointer pXVar3;
  bool bVar4;
  uint uVar5;
  long lVar6;
  ExtensionListing *ext;
  pointer __rhs;
  long lVar7;
  pointer pXVar8;
  pointer pXVar9;
  value_type local_c8;
  
  __rhs = (this->_instance_extensions).
          super__Vector_base<ExtensionListing,_std::allocator<ExtensionListing>_>._M_impl.
          super__Vector_impl_data._M_start;
  pEVar1 = (this->_instance_extensions).
           super__Vector_base<ExtensionListing,_std::allocator<ExtensionListing>_>._M_impl.
           super__Vector_impl_data._M_finish;
  do {
    if (__rhs == pEVar1) {
      return;
    }
    pXVar2 = (props->
             super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pXVar3 = (props->
             super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    lVar6 = 0;
    for (lVar7 = ((long)pXVar3 - (long)pXVar2) / 0x98 >> 2; 0 < lVar7; lVar7 = lVar7 + -1) {
      bVar4 = std::operator==(pXVar2->extensionName + lVar6,&__rhs->name);
      if (bVar4) {
        pXVar9 = (pointer)(pXVar2->extensionName + lVar6 + -0x10);
        goto LAB_00111927;
      }
      bVar4 = std::operator==(pXVar2[1].extensionName + lVar6,&__rhs->name);
      if (bVar4) {
        pXVar9 = (pointer)(pXVar2[1].extensionName + lVar6 + -0x10);
        goto LAB_00111927;
      }
      bVar4 = std::operator==(pXVar2[2].extensionName + lVar6,&__rhs->name);
      if (bVar4) {
        pXVar9 = (pointer)(pXVar2[2].extensionName + lVar6 + -0x10);
        goto LAB_00111927;
      }
      bVar4 = std::operator==(pXVar2[3].extensionName + lVar6,&__rhs->name);
      if (bVar4) {
        pXVar9 = (pointer)(pXVar2[3].extensionName + lVar6 + -0x10);
        goto LAB_00111927;
      }
      lVar6 = lVar6 + 0x260;
    }
    lVar7 = (((long)pXVar3 - (long)pXVar2) - lVar6) / 0x98;
    pXVar8 = (pointer)(pXVar2->extensionName + lVar6 + -0x10);
    if (lVar7 == 1) {
LAB_00111914:
      bVar4 = std::operator==(pXVar8->extensionName,&__rhs->name);
      pXVar9 = pXVar8;
      if (!bVar4) {
        pXVar9 = pXVar3;
      }
    }
    else if (lVar7 == 3) {
      bVar4 = std::operator==(pXVar2->extensionName + lVar6,&__rhs->name);
      pXVar9 = pXVar8;
      if (!bVar4) {
        pXVar8 = (pointer)(pXVar2[1].extensionName + lVar6 + -0x10);
        goto LAB_001118fd;
      }
    }
    else {
      pXVar9 = pXVar3;
      if (lVar7 == 2) {
LAB_001118fd:
        bVar4 = std::operator==(pXVar8->extensionName,&__rhs->name);
        pXVar9 = pXVar8;
        if (!bVar4) {
          pXVar8 = pXVar8 + 1;
          goto LAB_00111914;
        }
      }
    }
LAB_00111927:
    if (pXVar9 == (props->
                  super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>)
                  ._M_impl.super__Vector_impl_data._M_finish) {
      memset(&local_c8,0,0x98);
      local_c8.type = XR_TYPE_EXTENSION_PROPERTIES;
      strncpy(local_c8.extensionName,(__rhs->name)._M_dataplus._M_p,0x7f);
      local_c8.extensionName[0x7f] = '\0';
      local_c8.extensionVersion = __rhs->extension_version;
      std::vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>::push_back
                (props,&local_c8);
    }
    else {
      uVar5 = __rhs->extension_version;
      if (__rhs->extension_version < pXVar9->extensionVersion) {
        uVar5 = pXVar9->extensionVersion;
      }
      pXVar9->extensionVersion = uVar5;
    }
    __rhs = __rhs + 1;
  } while( true );
}

Assistant:

void ManifestFile::GetInstanceExtensionProperties(std::vector<XrExtensionProperties> &props) {
    GetExtensionProperties(_instance_extensions, props);
}